

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SafeInt.hpp
# Opt level: O0

SafeInt<short,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>
operator/(char lhs,
         SafeInt<short,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_> rhs)

{
  bool bVar1;
  short sVar2;
  SafeInt<short,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_> in_SI;
  char in_DIL;
  char *unaff_retaddr;
  char ret;
  SafeInt<short,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_> result;
  SafeInt<short,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>
  *in_stack_ffffffffffffffe8;
  undefined2 in_stack_fffffffffffffff0;
  undefined1 in_stack_fffffffffffffff2;
  char in_stack_fffffffffffffff3;
  undefined1 uVar3;
  SafeInt<short,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_> rhs_00;
  SafeInt<short,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>
  in_stack_fffffffffffffff8;
  undefined1 in_stack_fffffffffffffffa;
  SafeInt<short,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_> SVar4;
  short in_stack_fffffffffffffffe;
  
  SafeInt<short,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>::SafeInt
            ((SafeInt<short,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>
              *)&stack0xfffffffffffffff8);
  rhs_00.m_int = in_SI.m_int;
  bVar1 = DivisionCornerCaseHelper<short,_char,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>,_0>
          ::DivisionCornerCase1
                    (in_DIL,in_SI,
                     (SafeInt<short,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>
                      *)&stack0xfffffffffffffff8);
  if ((!bVar1) &&
     (SVar4.m_int = rhs_00.m_int,
     bVar1 = DivisionCornerCaseHelper2<short,_char,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>,_1>
             ::DivisionCornerCase2(in_stack_fffffffffffffff3,rhs_00,in_stack_ffffffffffffffe8),
     !bVar1)) {
    uVar3 = 0;
    sVar2 = SafeInt::operator_cast_to_short
                      ((SafeInt<short,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>
                        *)CONCAT26(in_SI.m_int,
                                   CONCAT24(rhs_00.m_int,
                                            (uint)CONCAT12(in_stack_fffffffffffffff2,
                                                           in_stack_fffffffffffffff0))));
    DivisionHelper<char,short,5>::
    DivideThrow<safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>>
              (unaff_retaddr,
               (short *)CONCAT26(in_stack_fffffffffffffffe,
                                 CONCAT24(SVar4.m_int,
                                          CONCAT13(in_DIL,CONCAT12(in_stack_fffffffffffffffa,
                                                                   in_stack_fffffffffffffff8.m_int))
                                         )),
               (char *)CONCAT26(in_SI.m_int,
                                CONCAT24(rhs_00.m_int,
                                         CONCAT13(uVar3,CONCAT12(in_stack_fffffffffffffff2,sVar2))))
              );
    SafeInt<short,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>::
    SafeInt<char>((SafeInt<short,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>
                   *)CONCAT26(in_SI.m_int,
                              CONCAT24(rhs_00.m_int,
                                       CONCAT13(uVar3,CONCAT12(in_stack_fffffffffffffff2,sVar2)))),
                  (char *)in_stack_ffffffffffffffe8);
    in_stack_fffffffffffffff8.m_int = in_stack_fffffffffffffffe;
  }
  return (SafeInt<short,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>)
         in_stack_fffffffffffffff8.m_int;
}

Assistant:

SAFEINT_CONSTEXPR14 SafeInt< T, E > operator /( U lhs, SafeInt< T, E > rhs ) SAFEINT_CPP_THROW
{
    // Corner case - has to be handled seperately
    SafeInt< T, E > result;
    if( DivisionCornerCaseHelper< T, U, E, (int)DivisionMethod< U, T >::method == (int)DivisionState_UnsignedSigned >::DivisionCornerCase1( lhs, rhs, result ) )
        return result;

    if( DivisionCornerCaseHelper2< T, U, E, safeint_internal::type_compare< T, U >::isBothSigned >::DivisionCornerCase2( lhs, rhs, result ) )
        return result;

    // Otherwise normal logic works with addition of bounds check when casting from U->T
    U ret = 0;
    DivisionHelper< U, T, DivisionMethod< U, T >::method >::template DivideThrow< E >( lhs, (T)rhs, ret );
    return SafeInt< T, E >( ret );
}